

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdiSubWindowPrivate::setEnabled(QMdiSubWindowPrivate *this,WindowStateAction action,bool enable)

{
  bool bVar1;
  QAction *pQVar2;
  
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x630c39);
  if (bVar1) {
    pQVar2 = QPointer<QAction>::operator->((QPointer<QAction> *)0x630c5a);
    QAction::setEnabled(SUB81(pQVar2,0));
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setEnabled(WindowStateAction action, bool enable)
{
    if (actions[action])
        actions[action]->setEnabled(enable);
}